

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O0

SQFunctionProto * __thiscall SQFuncState::BuildProto(SQFuncState *this)

{
  SQSharedState *ss;
  SQLineInfo *pSVar1;
  SQUnsignedInteger SVar2;
  SQUnsignedInteger nparameters;
  SQUnsignedInteger nfunctions;
  SQUnsignedInteger noutervalues;
  SQUnsignedInteger nlineinfos;
  SQUnsignedInteger nlocalvarinfos;
  SQUnsignedInteger ndefaultparams;
  SQFunctionProto *pSVar3;
  SQInteger SVar4;
  SQObjectPtr *pSVar5;
  SQOuterVar *pSVar6;
  SQLocalVarInfo *pSVar7;
  SQLineInfo *pSVar8;
  longlong *plVar9;
  SQInstruction *__src;
  SQUnsignedInteger local_98;
  SQUnsignedInteger nd;
  SQUnsignedInteger ni;
  SQUnsignedInteger nl;
  SQUnsignedInteger no;
  SQUnsignedInteger np;
  SQUnsignedInteger nf;
  SQInteger idx;
  SQObjectPtr val;
  undefined1 local_40 [8];
  SQObjectPtr key;
  SQObjectPtr refidx;
  SQFunctionProto *f;
  SQFuncState *this_local;
  
  ss = this->_ss;
  SVar2 = sqvector<SQInstruction>::size(&this->_instructions);
  SVar4 = this->_nliterals;
  nparameters = sqvector<SQObjectPtr>::size(&this->_parameters);
  nfunctions = sqvector<SQObjectPtr>::size(&this->_functions);
  noutervalues = sqvector<SQOuterVar>::size(&this->_outervalues);
  nlineinfos = sqvector<SQLineInfo>::size(&this->_lineinfos);
  nlocalvarinfos = sqvector<SQLocalVarInfo>::size(&this->_localvarinfos);
  ndefaultparams = sqvector<long_long>::size(&this->_defaultparams);
  pSVar3 = SQFunctionProto::Create
                     (ss,SVar2,SVar4,nparameters,nfunctions,noutervalues,nlineinfos,nlocalvarinfos,
                      ndefaultparams);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&key.super_SQObject._unVal);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)local_40);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&idx);
  pSVar3->_stacksize = this->_stacksize;
  ::SQObjectPtr::operator=(&pSVar3->_sourcename,&this->_sourcename);
  pSVar3->_bgenerator = (bool)(this->_bgenerator & 1);
  ::SQObjectPtr::operator=(&pSVar3->_name,&this->_name);
  while( true ) {
    SVar4 = SQTable::Next((this->_literals).super_SQObject._unVal.pTable,false,
                          (SQObjectPtr *)&key.super_SQObject._unVal,(SQObjectPtr *)local_40,
                          (SQObjectPtr *)&idx);
    if (SVar4 == -1) break;
    ::SQObjectPtr::operator=(pSVar3->_literals + val.super_SQObject._0_8_,(SQObjectPtr *)local_40);
    ::SQObjectPtr::operator=((SQObjectPtr *)&key.super_SQObject._unVal,SVar4);
  }
  np = 0;
  while( true ) {
    SVar2 = sqvector<SQObjectPtr>::size(&this->_functions);
    if (SVar2 <= np) break;
    pSVar5 = sqvector<SQObjectPtr>::operator[](&this->_functions,np);
    ::SQObjectPtr::operator=(pSVar3->_functions + np,pSVar5);
    np = np + 1;
  }
  no = 0;
  while( true ) {
    SVar2 = sqvector<SQObjectPtr>::size(&this->_parameters);
    if (SVar2 <= no) break;
    pSVar5 = sqvector<SQObjectPtr>::operator[](&this->_parameters,no);
    ::SQObjectPtr::operator=(pSVar3->_parameters + no,pSVar5);
    no = no + 1;
  }
  nl = 0;
  while( true ) {
    SVar2 = sqvector<SQOuterVar>::size(&this->_outervalues);
    if (SVar2 <= nl) break;
    pSVar6 = sqvector<SQOuterVar>::operator[](&this->_outervalues,nl);
    SQOuterVar::operator=(pSVar3->_outervalues + nl,pSVar6);
    nl = nl + 1;
  }
  ni = 0;
  while( true ) {
    SVar2 = sqvector<SQLocalVarInfo>::size(&this->_localvarinfos);
    if (SVar2 <= ni) break;
    pSVar7 = sqvector<SQLocalVarInfo>::operator[](&this->_localvarinfos,ni);
    SQLocalVarInfo::operator=(pSVar3->_localvarinfos + ni,pSVar7);
    ni = ni + 1;
  }
  nd = 0;
  while( true ) {
    SVar2 = sqvector<SQLineInfo>::size(&this->_lineinfos);
    if (SVar2 <= nd) break;
    pSVar8 = sqvector<SQLineInfo>::operator[](&this->_lineinfos,nd);
    pSVar1 = pSVar3->_lineinfos;
    pSVar1[nd]._line = pSVar8->_line;
    pSVar1[nd]._op = pSVar8->_op;
    nd = nd + 1;
  }
  local_98 = 0;
  while( true ) {
    SVar2 = sqvector<long_long>::size(&this->_defaultparams);
    if (SVar2 <= local_98) break;
    plVar9 = sqvector<long_long>::operator[](&this->_defaultparams,local_98);
    pSVar3->_defaultparams[local_98] = *plVar9;
    local_98 = local_98 + 1;
  }
  __src = sqvector<SQInstruction>::operator[](&this->_instructions,0);
  SVar2 = sqvector<SQInstruction>::size(&this->_instructions);
  memcpy(pSVar3->_instructions,__src,SVar2 << 3);
  pSVar3->_varparams = (ulong)(this->_varparams & 1);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&idx);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)local_40);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)&key.super_SQObject._unVal);
  return pSVar3;
}

Assistant:

SQFunctionProto *SQFuncState::BuildProto()
{

    SQFunctionProto *f=SQFunctionProto::Create(_ss,_instructions.size(),
        _nliterals,_parameters.size(),_functions.size(),_outervalues.size(),
        _lineinfos.size(),_localvarinfos.size(),_defaultparams.size());

    SQObjectPtr refidx,key,val;
    SQInteger idx;

    f->_stacksize = _stacksize;
    f->_sourcename = _sourcename;
    f->_bgenerator = _bgenerator;
    f->_name = _name;

    while((idx=_table(_literals)->Next(false,refidx,key,val))!=-1) {
        f->_literals[_integer(val)]=key;
        refidx=idx;
    }

    for(SQUnsignedInteger nf = 0; nf < _functions.size(); nf++) f->_functions[nf] = _functions[nf];
    for(SQUnsignedInteger np = 0; np < _parameters.size(); np++) f->_parameters[np] = _parameters[np];
    for(SQUnsignedInteger no = 0; no < _outervalues.size(); no++) f->_outervalues[no] = _outervalues[no];
    for(SQUnsignedInteger nl = 0; nl < _localvarinfos.size(); nl++) f->_localvarinfos[nl] = _localvarinfos[nl];
    for(SQUnsignedInteger ni = 0; ni < _lineinfos.size(); ni++) f->_lineinfos[ni] = _lineinfos[ni];
    for(SQUnsignedInteger nd = 0; nd < _defaultparams.size(); nd++) f->_defaultparams[nd] = _defaultparams[nd];

    memcpy(f->_instructions,&_instructions[0],_instructions.size()*sizeof(SQInstruction));

    f->_varparams = _varparams;

    return f;
}